

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::session_impl::on_dht_request
          (session_impl *this,string_view query,msg *request,entry *response)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar3;
  shared_ptr<libtorrent::plugin> *ext;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  entry *response_local;
  msg *request_local;
  session_impl *this_local;
  string_view query_local;
  
  this_00 = ::std::
            array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
            ::operator[](&this->m_ses_extensions,3);
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ::begin(this_00);
  ext = (shared_ptr<libtorrent::plugin> *)
        ::std::
        vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
        ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                                *)&ext);
    if (!bVar1) {
      return false;
    }
    this_01 = (__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
              ::operator*(&__end2);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    uVar2 = (*peVar3->_vptr_plugin[6])
                      (peVar3,query._M_len,query._M_str,&request->addr,request->message,response);
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool session_impl::on_dht_request(string_view query
		, dht::msg const& request, entry& response)
	{
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_ses_extensions[plugins_dht_request_idx])
		{
			if (ext->on_dht_request(query
				, request.addr, request.message, response))
				return true;
		}
#else
		TORRENT_UNUSED(query);
		TORRENT_UNUSED(request);
		TORRENT_UNUSED(response);
#endif
		return false;
	}